

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O3

void Am_Initializer::Do_Cleanup(void)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator it;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  p_Var4 = (am_initializer_list_abi_cxx11_->
           super__List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  p_Var2 = (_List_node_base *)am_initializer_list_abi_cxx11_;
  p_Var5 = (_List_node_base *)am_initializer_list_abi_cxx11_;
  if ((_List_node_base *)am_initializer_list_abi_cxx11_ != p_Var4) {
    do {
      p_Var3 = p_Var5->_M_prev;
      p_Var1 = p_Var3[1]._M_next[1]._M_prev;
      if (p_Var1 != (_List_node_base *)0x0) {
        (*(code *)p_Var1)();
        p_Var3 = p_Var5->_M_prev;
        p_Var4 = (am_initializer_list_abi_cxx11_->
                 super__List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>)._M_impl.
                 _M_node.super__List_node_base._M_next;
        p_Var2 = (_List_node_base *)am_initializer_list_abi_cxx11_;
      }
      p_Var5 = p_Var3;
    } while (p_Var3 != p_Var4);
  }
  if (p_Var4 != p_Var2) {
    do {
      operator_delete(p_Var4[1]._M_next);
      p_Var4 = (((_List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)&p_Var4->_M_next
                )->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)am_initializer_list_abi_cxx11_);
  }
  return;
}

Assistant:

void
Am_Initializer::Do_Cleanup()
{
  for (INITIALIZERLIST::reverse_iterator reverseIt =
           am_initializer_list->rbegin();
       reverseIt != am_initializer_list->rend(); ++reverseIt) {
    // check if we have a function to call
    if ((*reverseIt)->cleanup != static_cast<Am_Initializer_Procedure *>(nullptr)) {
// call the cleanup() function stored in the Am_Initializer object
#ifdef LEAK_TRACE
      DERR("Cleaningup: " << (*reverseIt)->name << "\t\tPriority: "
                          << (*reverseIt)->priority << std::endl);
#endif
      (*reverseIt)->cleanup();
    }
  }

  // iterate through the list if Am_Initializer objects and free them
  for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
       it != am_initializer_list->end(); ++it) {
    delete (*it);
  }
}